

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void xPredIntraAngAdi_XY_21(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int xoffsets [64];
  uint auStack_238 [64];
  uint auStack_138 [66];
  
  uVar6 = 0;
  uVar2 = 0;
  if (0 < iWidth) {
    uVar2 = (ulong)(uint)iWidth;
  }
  uVar4 = 0x5d;
  for (; uVar2 != uVar6; uVar6 = uVar6 + 1) {
    auStack_138[uVar6] = uVar4 >> 3 & 0x1f;
    auStack_238[uVar6] = uVar4 >> 8;
    uVar4 = uVar4 + 0x5d;
  }
  uVar4 = iWidth * 0x5d >> 8;
  if (iHeight <= (int)uVar4) {
    uVar4 = iHeight;
  }
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  uVar11 = (ulong)uVar4;
  uVar8 = 0xb;
  uVar6 = 0;
  while (uVar6 != uVar11) {
    uVar7 = uVar8 >> 2;
    uVar4 = (int)((double)((int)(uVar6 + 1) << 8) / 93.0 + 0.9999) - 1;
    uVar5 = (int)uVar8 * 8 & 0x18;
    if (iWidth <= (int)uVar4) {
      uVar4 = iWidth;
    }
    uVar10 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar10 = 0;
    }
    uVar4 = (int)uVar2 - (int)uVar10;
    for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      lVar3 = (long)(int)auStack_238[uVar9];
      uVar1 = auStack_138[uVar9];
      dst[uVar9] = (pel)(pSrc[lVar3 + (1 - uVar6)] * uVar1 +
                         (uVar1 + 0x20) * (uint)pSrc[lVar3 - uVar6] +
                         (0x40 - uVar1) * (uint)pSrc[lVar3 + (-1 - uVar6)] +
                         (0x20 - uVar1) * (uint)pSrc[lVar3 + (-2 - uVar6)] + 0x40 >> 7);
      uVar4 = uVar4 + 1;
    }
    for (; uVar4 != uVar10; uVar10 = uVar10 + 1) {
      dst[uVar10] = (pel)((uint)pSrc[uVar10 - uVar7] * (uVar5 + 0x20) +
                          (uint)pSrc[uVar10 + (1 - uVar7)] * (0x40 - uVar5) +
                          (uint)pSrc[uVar10 + (2 - uVar7)] * (0x20 - uVar5) +
                          pSrc[uVar10 + (-1 - uVar7)] * uVar5 + 0x40 >> 7);
    }
    dst = dst + i_dst;
    uVar8 = uVar8 + 0xb;
    uVar6 = uVar6 + 1;
  }
  for (; (long)uVar11 < (long)iHeight; uVar11 = uVar11 + 1) {
    for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      lVar3 = (long)(int)auStack_238[uVar6];
      uVar4 = auStack_138[uVar6];
      dst[uVar6] = (pel)(pSrc[lVar3 + (1 - uVar11)] * uVar4 +
                         (uVar4 + 0x20) * (uint)pSrc[lVar3 - uVar11] +
                         (0x40 - uVar4) * (uint)pSrc[lVar3 + (-1 - uVar11)] +
                         (0x20 - uVar4) * (uint)pSrc[lVar3 + (-2 - uVar11)] + 0x40 >> 7);
    }
    dst = dst + i_dst;
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_XY_21(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    int i, j;
    pel *rpSrc = pSrc;
    pel *dst_base = dst - 4 * i_dst - 11;
    int xoffsets[64];
    int xsteps[64];
    int iTempD = 93;
    int step2_height = (93 * iWidth) >> 8;

    for (i = 0; i < iWidth; i++, iTempD += 93) {
        xoffsets[i] = (iTempD >> 3) & 0x1f;
        xsteps[i] = iTempD >> 8;
    }

    iTempD = 11;
    step2_height = min(step2_height, iHeight);

    for (j = 0; j < step2_height; j++, iTempD += 11) {
        int step1_width = (int)(((j + 1) << 8) / 93.0 + 0.9999) - 1;
        int offsetx = (iTempD << 3) & 0x1f;
        pel *px = pSrc - (iTempD >> 2);
        int a = 32 - offsetx, b = 64 - offsetx, c = 32 + offsetx;

        step1_width = min(step1_width, iWidth);

        for (i = 0; i < step1_width; i++) {
            pel *py = rpSrc - j + xsteps[i];
            int offsety = xoffsets[i];
            dst[i] = (py[-2] * (32 - offsety) + py[-1] * (64 - offsety) + py[0] * (32 + offsety) + py[1] * offsety + 64) >> 7;
        }

        px += i;

        for (; i < iWidth; i++, px++) {
            dst[i] = (px[2] * a + px[1] * b + px[0] * c + px[-1] * offsetx + 64) >> 7;
        }
        dst_base += i_dst;
        dst += i_dst;
    }

    for (; j < iHeight; j++) {
        for (i = 0; i < iWidth; i++) {
            pel *py = rpSrc - j + xsteps[i];
            int offsety = xoffsets[i];
            dst[i] = (py[-2] * (32 - offsety) + py[-1] * (64 - offsety) + py[0] * (32 + offsety) + py[1] * offsety + 64) >> 7;
        }
        dst_base += i_dst;
        dst += i_dst;
    }
}